

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandCut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk;
  Cut_Man_t *pMan;
  Cut_Oracle_t *p;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  Cut_Params_t Params;
  uint local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Params.nIdsMax = 0;
  Params.nBitShift = 0;
  Params.fLocal = 0;
  Params.fRecord = 0;
  Params.nVarsMax = 5;
  Params.nKeepMax = 1000;
  local_c8 = 1;
  Params.nCutSet = 0;
  Params.fTruth = 1;
  Params.fFilter = 1;
  Params.fSeq = 0;
  Params.fDrop = 0;
  Params.fDag = 1;
  Params.fTree = 0;
  Params.fGlobal = 0;
  local_98 = 0;
  Extra_UtilGetoptReset();
  local_e4 = Params.fLocal;
  local_e0 = Params.fGlobal;
  local_dc = Params.fTree;
  local_d8 = Params.fDag;
  local_d4 = Params.fDrop;
  local_d0 = Params.fFilter;
  local_cc = Params.fTruth;
  local_e8 = Params.nVarsMax;
  local_ec = Params.nKeepMax;
  local_c0 = 5;
  local_3c = 1000;
  local_c4 = 0;
  local_9c = 0;
  local_94 = 0;
  local_bc = 0;
  local_b4 = 0;
  local_b0 = 0;
  local_ac = 0;
  local_a8 = 0;
  bVar1 = false;
  local_b8 = local_c8;
  local_a4 = local_c8;
  local_a0 = local_c8;
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"KMtfdxyglzamjvosh");
    iVar5 = globalUtilOptind;
    switch(iVar2) {
    case 0x61:
      local_b8 = local_b8 ^ 1;
      break;
    case 0x62:
    case 99:
    case 0x65:
    case 0x68:
    case 0x69:
    case 0x6b:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x75:
    case 0x77:
      goto switchD_0022baf8_caseD_62;
    case 100:
      local_d4 = local_98 ^ 1;
      local_98 = local_d4;
      break;
    case 0x66:
      local_d0 = local_a4 ^ 1;
      local_a4 = local_d0;
      break;
    case 0x67:
      local_e0 = local_9c ^ 1;
      local_9c = local_e0;
      break;
    case 0x6a:
      local_b0 = local_b0 ^ 1;
      break;
    case 0x6c:
      local_e4 = local_94 ^ 1;
      local_94 = local_e4;
      break;
    case 0x6d:
      local_b4 = local_b4 ^ 1;
      break;
    case 0x6f:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x73:
      local_a8 = local_a8 ^ 1;
      break;
    case 0x74:
      local_cc = local_a0 ^ 1;
      local_a0 = local_cc;
      break;
    case 0x76:
      local_ac = local_ac ^ 1;
      break;
    case 0x78:
      local_d8 = local_c8 ^ 1;
      local_c8 = local_d8;
      break;
    case 0x79:
      local_dc = local_c4 ^ 1;
      local_c4 = local_dc;
      break;
    case 0x7a:
      local_bc = local_bc ^ 1;
      break;
    default:
      if (iVar2 == 0x4b) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-K\" should be followed by an integer.\n";
LAB_0022be4b:
          Params.fLocal = local_e4;
          Params.fGlobal = local_e0;
          Params.fTree = local_dc;
          Params.fDag = local_d8;
          Params.fDrop = local_d4;
          Params.fFilter = local_d0;
          Params.fTruth = local_cc;
          Params.nKeepMax = local_ec;
          Params.nVarsMax = local_e8;
          Abc_Print(-1,pcVar4);
          goto LAB_0022be55;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_e8 = uVar3;
        local_c0 = uVar3;
      }
      else {
        if (iVar2 != 0x4d) {
          if (iVar2 == -1) {
            Params.fLocal = local_e4;
            Params.fGlobal = local_e0;
            Params.fTree = local_dc;
            Params.fDag = local_d8;
            Params.fDrop = local_d4;
            Params.fFilter = local_d0;
            Params.fTruth = local_cc;
            Params.nKeepMax = local_ec;
            Params.nVarsMax = local_e8;
            Params.fNpnSave = local_a8;
            Params.fVerbose = local_ac;
            Params.fAdjust = local_b0;
            Params.fMap = local_b4;
            Params.fRecordAig = local_b8;
            Params.fFancy = local_bc;
            if (pNtk == (Abc_Ntk_t *)0x0) {
              pcVar4 = "Empty network.\n";
            }
            else if (pNtk->ntkType == ABC_NTK_STRASH) {
              if (local_c0 - 0xd < 0xfffffff6) {
                Abc_Print(-1,"Can only compute the cuts for %d <= K <= %d.\n",3,0xc);
                return 1;
              }
              if (local_c4 == 0 || local_c8 == 0) {
                if (local_a8 != 0) {
                  Params.nVarsMax = 6;
                  Params.fTruth = 1;
                }
                if (bVar1) {
                  Params.fRecord = 1;
                }
                pMan = Abc_NtkCuts(pNtk,&Params);
                if (bVar1) {
                  p = Cut_OracleStart(pMan);
                }
                else {
                  p = (Cut_Oracle_t *)0x0;
                }
                Cut_ManStop(pMan);
                if (bVar1) {
                  if (p == (Cut_Oracle_t *)0x0) {
                    __assert_fail("pCutOracle",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                                  ,0x3156,"int Abc_CommandCut(Abc_Frame_t *, int, char **)");
                  }
                  Abc_NtkCutsOracle(pNtk,p);
                  Cut_OracleStop(p);
                  return 0;
                }
                return 0;
              }
              pcVar4 = "Cannot compute both DAG cuts and tree cuts at the same time.\n";
            }
            else {
              pcVar4 = "Cut computation is available only for AIGs (run \"strash\").\n";
            }
            iVar5 = -1;
            goto LAB_0022c02d;
          }
          goto switchD_0022baf8_caseD_62;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
          goto LAB_0022be4b;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_ec = uVar3;
        local_3c = uVar3;
      }
      globalUtilOptind = iVar5 + 1;
      if ((int)uVar3 < 0) {
switchD_0022baf8_caseD_62:
        Params.fLocal = local_e4;
        Params.fGlobal = local_e0;
        Params.fTree = local_dc;
        Params.fDag = local_d8;
        Params.fDrop = local_d4;
        Params.fFilter = local_d0;
        Params.fTruth = local_cc;
        Params.nKeepMax = local_ec;
        Params.nVarsMax = local_e8;
LAB_0022be55:
        iVar5 = -2;
        Abc_Print(-2,"usage: cut [-K num] [-M num] [-tfdcovamjsvh]\n");
        Abc_Print(-2,"\t         computes k-feasible cuts for the AIG\n");
        Abc_Print(-2,"\t-K num : max number of leaves (%d <= num <= %d) [default = %d]\n",3,0xc,
                  (ulong)local_c0);
        Abc_Print(-2,"\t-M num : max number of cuts stored at a node [default = %d]\n",
                  (ulong)local_3c);
        pcVar6 = "yes";
        pcVar4 = "yes";
        if (local_a0 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-t     : toggle truth table computation [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_a4 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-f     : toggle filtering of duplicated/dominated [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_98 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle dropping when fanouts are done [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_c8 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-x     : toggle computing only DAG cuts [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_c4 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-y     : toggle computing only tree cuts [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_9c == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-g     : toggle computing only global cuts [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_94 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-l     : toggle computing only local cuts [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_bc == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-z     : toggle fancy computations [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_b8 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-a     : toggle recording cut functions [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_b4 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-m     : toggle delay-oriented FPGA mapping [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_b0 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-j     : toggle removing fanouts due to XOR/MUX [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_a8 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-s     : toggle creating library of 6-var functions [default = %s]\n",pcVar4
                 );
        if (local_ac == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
        pcVar4 = "\t-h     : print the command usage\n";
LAB_0022c02d:
        Abc_Print(iVar5,pcVar4);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int Abc_CommandCut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cut_Params_t Params, * pParams = &Params;
    Cut_Man_t * pCutMan;
    Cut_Oracle_t * pCutOracle = NULL;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fOracle;
    extern Cut_Man_t * Abc_NtkCuts( Abc_Ntk_t * pNtk, Cut_Params_t * pParams );
    extern void Abc_NtkCutsOracle( Abc_Ntk_t * pNtk, Cut_Oracle_t * pCutOracle );

    // set defaults
    fOracle = 0;
    memset( pParams, 0, sizeof(Cut_Params_t) );
    pParams->nVarsMax    = 5;     // the max cut size ("k" of the k-feasible cuts)
    pParams->nKeepMax    = 1000;  // the max number of cuts kept at a node
    pParams->fTruth      = 1;     // compute truth tables
    pParams->fFilter     = 1;     // filter dominated cuts
    pParams->fDrop       = 0;     // drop cuts on the fly
    pParams->fDag        = 1;     // compute DAG cuts
    pParams->fTree       = 0;     // compute tree cuts
    pParams->fGlobal     = 0;     // compute global cuts
    pParams->fLocal      = 0;     // compute local cuts
    pParams->fFancy      = 0;     // compute something fancy
    pParams->fRecordAig  = 1;     // compute something fancy
    pParams->fMap        = 0;     // compute mapping delay
    pParams->fAdjust     = 0;     // removes useless fanouts
    pParams->fNpnSave    = 0;     // enables dumping truth tables
    pParams->fVerbose    = 0;     // the verbosiness flag
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KMtfdxyglzamjvosh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nVarsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nVarsMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nKeepMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nKeepMax < 0 )
                goto usage;
            break;
        case 't':
            pParams->fTruth ^= 1;
            break;
        case 'f':
            pParams->fFilter ^= 1;
            break;
        case 'd':
            pParams->fDrop ^= 1;
            break;
        case 'x':
            pParams->fDag ^= 1;
            break;
        case 'y':
            pParams->fTree ^= 1;
            break;
        case 'g':
            pParams->fGlobal ^= 1;
            break;
        case 'l':
            pParams->fLocal ^= 1;
            break;
        case 'z':
            pParams->fFancy ^= 1;
            break;
        case 'a':
            pParams->fRecordAig ^= 1;
            break;
        case 'm':
            pParams->fMap ^= 1;
            break;
        case 'j':
            pParams->fAdjust ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'o':
            fOracle ^= 1;
            break;
        case 's':
            pParams->fNpnSave ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cut computation is available only for AIGs (run \"strash\").\n" );
        return 1;
    }
    if ( pParams->nVarsMax < CUT_SIZE_MIN || pParams->nVarsMax > CUT_SIZE_MAX )
    {
        Abc_Print( -1, "Can only compute the cuts for %d <= K <= %d.\n", CUT_SIZE_MIN, CUT_SIZE_MAX );
        return 1;
    }
    if ( pParams->fDag && pParams->fTree )
    {
        Abc_Print( -1, "Cannot compute both DAG cuts and tree cuts at the same time.\n" );
        return 1;
    }

    if ( pParams->fNpnSave )
    {
        pParams->nVarsMax = 6;
        pParams->fTruth = 1;
    }

    if ( fOracle )
        pParams->fRecord = 1;
    pCutMan = Abc_NtkCuts( pNtk, pParams );
    if ( fOracle )
        pCutOracle = Cut_OracleStart( pCutMan );
    Cut_ManStop( pCutMan );
    if ( fOracle )
    {
        assert(pCutOracle);
        Abc_NtkCutsOracle( pNtk, pCutOracle );
        Cut_OracleStop( pCutOracle );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: cut [-K num] [-M num] [-tfdcovamjsvh]\n" );
    Abc_Print( -2, "\t         computes k-feasible cuts for the AIG\n" );
    Abc_Print( -2, "\t-K num : max number of leaves (%d <= num <= %d) [default = %d]\n",     CUT_SIZE_MIN, CUT_SIZE_MAX, pParams->nVarsMax );
    Abc_Print( -2, "\t-M num : max number of cuts stored at a node [default = %d]\n",        pParams->nKeepMax );
    Abc_Print( -2, "\t-t     : toggle truth table computation [default = %s]\n",             pParams->fTruth?   "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle filtering of duplicated/dominated [default = %s]\n",   pParams->fFilter?  "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dropping when fanouts are done [default = %s]\n",      pParams->fDrop?    "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle computing only DAG cuts [default = %s]\n",             pParams->fDag?     "yes": "no" );
    Abc_Print( -2, "\t-y     : toggle computing only tree cuts [default = %s]\n",            pParams->fTree?    "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle computing only global cuts [default = %s]\n",          pParams->fGlobal?  "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle computing only local cuts [default = %s]\n",           pParams->fLocal?   "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle fancy computations [default = %s]\n",                  pParams->fFancy?   "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle recording cut functions [default = %s]\n",             pParams->fRecordAig?"yes": "no" );
    Abc_Print( -2, "\t-m     : toggle delay-oriented FPGA mapping [default = %s]\n",         pParams->fMap?     "yes": "no" );
    Abc_Print( -2, "\t-j     : toggle removing fanouts due to XOR/MUX [default = %s]\n",     pParams->fAdjust?  "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating library of 6-var functions [default = %s]\n", pParams->fNpnSave?  "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",        pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}